

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptSamplerState(HlslGrammar *this)

{
  HlslToken *pHVar1;
  pointer pcVar2;
  size_type sVar3;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 aVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  HlslParseContext *pHVar9;
  _func_int **pp_Var10;
  size_type sVar11;
  TString stateName;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  HlslToken local_80;
  HlslToken local_58;
  
  bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  bVar6 = true;
  if (bVar5) {
    pHVar1 = &(this->super_HlslTokenStream).token;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this->parseContext,pHVar1,"unimplemented","immediate sampler state","");
    local_58.field_2.string = (TString *)0x0;
    bVar5 = acceptIdentifier(this,&local_58);
    if (bVar5) {
      do {
        aVar4 = local_58.field_2;
        local_a8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        pcVar2 = ((aVar4.string)->_M_dataplus)._M_p;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_a8,pcVar2,pcVar2 + (aVar4.string)->_M_string_length);
        sVar3 = local_a8._M_string_length;
        pcVar2 = local_a8._M_dataplus._M_p;
        if (local_a8._M_string_length != 0) {
          sVar11 = 0;
          do {
            iVar7 = tolower((int)pcVar2[sVar11]);
            pcVar2[sVar11] = (char)iVar7;
            sVar11 = sVar11 + 1;
          } while (sVar3 != sVar11);
        }
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (!bVar5) {
          pHVar9 = this->parseContext;
          pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar8 = "assign";
          goto LAB_00427443;
        }
        iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (&local_a8,"minlod");
        if (((iVar7 == 0) ||
            (iVar7 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(&local_a8,"maxlod"), iVar7 == 0)) ||
           (iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_a8,"maxanisotropy"), iVar7 == 0)) {
          bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
          if (!bVar5) {
            pHVar9 = this->parseContext;
            pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar8 = "integer";
            goto LAB_00427443;
          }
          bVar5 = acceptLiteral(this,(TIntermTyped **)&local_80);
          if (!bVar5) {
            return false;
          }
        }
        else {
          iVar7 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&local_a8,"filter");
          if (iVar7 == 0) {
            bVar5 = acceptIdentifier(this,&local_80);
            if (!bVar5) {
              pHVar9 = this->parseContext;
              pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
              ;
              pcVar8 = "filter mode";
              goto LAB_00427443;
            }
          }
          else {
            iVar7 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&local_a8,"addressu");
            if (((iVar7 == 0) ||
                (iVar7 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         ::compare(&local_a8,"addressv"), iVar7 == 0)) ||
               (iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(&local_a8,"addressw"), iVar7 == 0)) {
              bVar5 = acceptIdentifier(this,&local_80);
              if (!bVar5) {
                pHVar9 = this->parseContext;
                pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar8 = "texture address mode";
                goto LAB_00427443;
              }
            }
            else {
              iVar7 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&local_a8,"miplodbias");
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(&local_a8,"bordercolor");
                if (iVar7 == 0) {
                  return false;
                }
                pHVar9 = this->parseContext;
                pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar8 = "texture state";
                goto LAB_00427443;
              }
              bVar5 = acceptLiteral(this,(TIntermTyped **)&local_80);
              if (!bVar5) {
                pHVar9 = this->parseContext;
                pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions.
                           _vptr_TParseVersions;
                pcVar8 = "lod bias";
                goto LAB_00427443;
              }
            }
          }
        }
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
        if (!bVar5) {
          pHVar9 = this->parseContext;
          pp_Var10 = (pHVar9->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar8 = "semicolon";
LAB_00427443:
          (*pp_Var10[0x2d])(pHVar9,pHVar1,"Expected",pcVar8,"");
          return false;
        }
        local_58.field_2.string = (TString *)0x0;
        bVar5 = acceptIdentifier(this,&local_58);
      } while (bVar5);
    }
    bVar6 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  }
  return bVar6;
}

Assistant:

bool HlslGrammar::acceptSamplerState()
{
    // TODO: this should be genericized to accept a list of valid tokens and
    // return token/value pairs.  Presently it is specific to texture values.

    if (! acceptTokenClass(EHTokLeftBrace))
        return true;

    parseContext.warn(token.loc, "unimplemented", "immediate sampler state", "");

    do {
        // read state name
        HlslToken state;
        if (! acceptIdentifier(state))
            break;  // end of list

        // FXC accepts any case
        TString stateName = *state.string;
        std::transform(stateName.begin(), stateName.end(), stateName.begin(), ::tolower);

        if (! acceptTokenClass(EHTokAssign)) {
            expected("assign");
            return false;
        }

        if (stateName == "minlod" || stateName == "maxlod") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* lod = nullptr;
            if (! acceptLiteral(lod))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "maxanisotropy") {
            if (! peekTokenClass(EHTokIntConstant)) {
                expected("integer");
                return false;
            }

            TIntermTyped* maxAnisotropy = nullptr;
            if (! acceptLiteral(maxAnisotropy))  // should never fail, since we just looked for an integer
                return false;
        } else if (stateName == "filter") {
            HlslToken filterMode;
            if (! acceptIdentifier(filterMode)) {
                expected("filter mode");
                return false;
            }
        } else if (stateName == "addressu" || stateName == "addressv" || stateName == "addressw") {
            HlslToken addrMode;
            if (! acceptIdentifier(addrMode)) {
                expected("texture address mode");
                return false;
            }
        } else if (stateName == "miplodbias") {
            TIntermTyped* lodBias = nullptr;
            if (! acceptLiteral(lodBias)) {
                expected("lod bias");
                return false;
            }
        } else if (stateName == "bordercolor") {
            return false;
        } else {
            expected("texture state");
            return false;
        }

        // SEMICOLON
        if (! acceptTokenClass(EHTokSemicolon)) {
            expected("semicolon");
            return false;
        }
    } while (true);

    if (! acceptTokenClass(EHTokRightBrace))
        return false;

    return true;
}